

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O3

int uv_if_indextoname(uint ifindex,char *buffer,size_t *size)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  int *piVar3;
  char ifname_buf [17];
  char acStack_38 [32];
  
  iVar1 = -0x16;
  if (size != (size_t *)0x0 && buffer != (char *)0x0) {
    if (*size != 0) {
      pcVar2 = if_indextoname(ifindex,acStack_38);
      if (pcVar2 == (char *)0x0) {
        piVar3 = __errno_location();
        iVar1 = -*piVar3;
      }
      else {
        __n = strnlen(acStack_38,0x11);
        if (__n < *size) {
          memcpy(buffer,acStack_38,__n);
          buffer[__n] = '\0';
          *size = __n;
          iVar1 = 0;
        }
        else {
          *size = __n + 1;
          iVar1 = -0x69;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int uv_if_indextoname(unsigned int ifindex, char* buffer, size_t* size) {
  char ifname_buf[UV_IF_NAMESIZE];
  size_t len;

  if (buffer == NULL || size == NULL || *size == 0)
    return UV_EINVAL;

  if (if_indextoname(ifindex, ifname_buf) == NULL)
    return UV__ERR(errno);

  len = strnlen(ifname_buf, sizeof(ifname_buf));

  if (*size <= len) {
    *size = len + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, ifname_buf, len);
  buffer[len] = '\0';
  *size = len;

  return 0;
}